

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogicalOperandsTests.cpp
# Opt level: O0

void __thiscall NotOperandTests::Run(NotOperandTests *this)

{
  anon_class_1_0_00000001 local_69;
  function<void_()> local_68;
  allocator local_31;
  string local_30 [32];
  NotOperandTests *local_10;
  NotOperandTests *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"NotOperand is an Operand",&local_31);
  std::function<void()>::function<NotOperandTests::Run()::_lambda()_1_,void>
            ((function<void()> *)&local_68,&local_69);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_30,&local_68);
  std::function<void_()>::~function(&local_68);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  GivenOperandWhenResultOfOperandIsXThenResultIsZ(this,true,false);
  GivenOperandWhenResultOfOperandIsXThenResultIsZ(this,false,true);
  return;
}

Assistant:

virtual void Run()
	{
		Then("NotOperand is an Operand", [&]()
		{
			AssertThat(ut11::detail::IsOperand < ut11::detail::NotOperand < MockOperand<int> >> ::value, ut11::Is::True);
		});

		GivenOperandWhenResultOfOperandIsXThenResultIsZ(true, false);
		GivenOperandWhenResultOfOperandIsXThenResultIsZ(false, true);
	}